

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  void *__s;
  array_container_t *cont;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  _Bool _Var13;
  void *local_90;
  long local_60;
  
  if (ra->size < 1) {
    _Var13 = true;
    local_60 = 0;
    local_90 = (void *)0x0;
  }
  else {
    lVar11 = 0;
    uVar7 = 0;
    uVar10 = 0;
    local_90 = (void *)0x0;
    local_60 = 0;
    bVar4 = false;
    lVar8 = 0;
    uVar9 = 0;
    do {
      cont = (array_container_t *)ra->containers[lVar11];
      if (ra->typecodes[lVar11] == '\x04') {
        ra->typecodes[lVar11] = *(uint8_t *)&cont->array;
        cont = *(array_container_t **)cont;
      }
      uVar3 = ra->typecodes[lVar11];
      if (uVar3 == '\x03') {
        iVar6 = run_container_cardinality((run_container_t *)cont);
        lVar8 = (long)iVar6;
      }
      else if ((uVar3 == '\x02') || (uVar3 == '\x01')) {
        lVar8 = (long)cont->cardinality;
      }
      uVar1 = uVar9;
      if (uVar7 < limit + offset && offset <= (lVar8 + uVar7) - 1) {
        if (bVar4) {
LAB_0012892b:
          uVar1 = lVar8 + uVar9;
          if (uVar10 < uVar1) {
            sVar2 = (uVar10 + lVar8) * 4;
            __s = roaring_malloc(sVar2);
            if (__s == (void *)0x0) {
              if (local_90 != (void *)0x0) {
                roaring_free(local_90);
              }
            }
            else {
              memset(__s,0,sVar2);
              memcpy(__s,local_90,uVar9 * 4);
              roaring_free(local_90);
              local_90 = __s;
              uVar10 = uVar10 + lVar8;
            }
            if (__s == (void *)0x0) {
              cVar5 = '\x01';
              bVar12 = false;
              goto LAB_00128aa5;
            }
          }
          uVar3 = ra->typecodes[lVar11];
          if (uVar3 == '\x03') {
            run_container_to_uint32_array
                      ((void *)((long)local_90 + uVar9 * 4),(run_container_t *)cont,
                       (uint)ra->keys[lVar11] << 0x10);
          }
          else if (uVar3 == '\x02') {
            array_container_to_uint32_array
                      ((void *)((long)local_90 + uVar9 * 4),cont,(uint)ra->keys[lVar11] << 0x10);
          }
          else if (uVar3 == '\x01') {
            bitset_container_to_uint32_array
                      ((uint32_t *)((long)local_90 + uVar9 * 4),(bitset_container_t *)cont,
                       (uint)ra->keys[lVar11] << 0x10);
          }
          goto LAB_00128a82;
        }
        local_60 = offset - uVar7;
        sVar2 = (local_60 + limit) * 4;
        local_90 = roaring_malloc(sVar2);
        if (local_90 != (void *)0x0) {
          memset(local_90,0,sVar2);
          bVar4 = true;
          uVar10 = local_60 + limit;
          goto LAB_0012892b;
        }
        cVar5 = '\x01';
        bVar4 = true;
        local_90 = (void *)0x0;
        bVar12 = false;
      }
      else {
LAB_00128a82:
        uVar9 = uVar1;
        uVar7 = uVar7 + lVar8;
        bVar12 = uVar9 - local_60 < limit;
        cVar5 = !bVar12 * '\x02';
      }
LAB_00128aa5:
      if (!bVar12) goto LAB_00128af6;
      lVar11 = lVar11 + 1;
    } while (lVar11 < ra->size);
    cVar5 = '\x02';
LAB_00128af6:
    _Var13 = cVar5 == '\x02';
  }
  if ((_Var13 != false) && (local_90 != (void *)0x0)) {
    memcpy(ans,(void *)((long)local_90 + local_60 * 4),limit << 2);
    free(local_90);
  }
  return _Var13;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset,
                           size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {
        const container_t *c =
            container_unwrap_shared(ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit) {
            if (!first) {
                // first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)roaring_malloc(sizeof(*t_ans) *
                                                   (first_skip + limit));
                if (t_ans == NULL) {
                    return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit));
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len) {
                uint32_t *append_ans = (uint32_t *)roaring_malloc(
                    sizeof(*append_ans) * (cur_len + t_limit));
                if (append_ans == NULL) {
                    if (t_ans != NULL) roaring_free(t_ans);
                    return false;
                }
                memset(append_ans, 0,
                       sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                roaring_free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_bitset(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_array(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_run(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr - first_skip >= limit) break;
    }
    if (t_ans != NULL) {
        memcpy(ans, t_ans + first_skip, limit * sizeof(uint32_t));
        free(t_ans);
    }
    return true;
}